

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int64 intConst,Instr *instr,Opnd *opnd)

{
  Int64ConstantToValueMap *pIVar1;
  Type piVar2;
  Sym *sym;
  code *pcVar3;
  Opnd *opnd_00;
  bool bVar4;
  uint uVar5;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar6;
  Value *pVVar7;
  Value *pVVar8;
  Type this_01;
  uint depth;
  uint uVar9;
  long local_48;
  int64 symStoreIntConstantValue;
  Opnd *local_38;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x10a6,"(instr->m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "instr->m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pIVar1 = this->int64ConstantToValueMap;
  piVar2 = pIVar1->buckets;
  depth = 0;
  symStoreIntConstantValue = (int64)instr;
  local_38 = opnd;
  if (piVar2 != (Type)0x0) {
    uVar5 = JsUtil::
            BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((int)intConst * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar9 = piVar2[uVar5];
    if (-1 < (int)uVar9) {
      depth = 0;
      do {
        if (pIVar1->entries[uVar9].
            super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<long,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
            .super_KeyValueEntryDataLayout2<long,_Value_*>.key == intConst) {
          this_01 = pIVar1->stats;
          goto LAB_00456088;
        }
        depth = depth + 1;
        uVar9 = pIVar1->entries[uVar9].
                super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<long,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
                .super_KeyValueEntryDataLayout2<long,_Value_*>.next;
      } while (-1 < (int)uVar9);
    }
  }
  this_01 = pIVar1->stats;
  uVar9 = 0xffffffff;
LAB_00456088:
  if (this_01 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_01,depth);
  }
  if ((int)uVar9 < 0) {
    pVVar8 = (Value *)0x0;
  }
  else {
    pVVar8 = pIVar1->entries[uVar9].
             super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
             super_KeyValueEntry<long,_Value_*>.
             super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
             .super_KeyValueEntryDataLayout2<long,_Value_*>.value;
  }
  if ((((pVVar8 == (Value *)0x0) || (sym = pVVar8->valueInfo->symStore, sym == (Sym *)0x0)) ||
      (bVar4 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym), !bVar4)) ||
     ((pVVar7 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym),
      pVVar7 == (Value *)0x0 || (pVVar7->valueNumber != pVVar8->valueNumber)))) {
    pVVar8 = (Value *)0x0;
  }
  else {
    bVar4 = ValueInfo::TryGetInt64ConstantValue(pVVar7->valueInfo,&local_48,false);
    pVVar8 = (Value *)0x0;
    if ((bVar4) && (pVVar8 = (Value *)0x0, local_48 == intConst)) {
      pVVar8 = pVVar7;
    }
  }
  opnd_00 = local_38;
  if (pVVar8 == (Value *)0x0) {
    pVVar8 = NewInt64ConstantValue(this,intConst,(Instr *)symStoreIntConstantValue);
  }
  pVVar8 = GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,pVVar8,opnd_00);
  return pVVar8;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int64 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Assert(instr->m_func->GetJITFunctionBody()->IsWasmFunction());

    Value *value = nullptr;
    Value *const cachedValue = this->int64ConstantToValueMap->Lookup(intConst, nullptr);

    if (cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && this->currentBlock->globOptData.IsLive(symStore))
        {

            Value *const symStoreValue = this->currentBlock->globOptData.FindValue(symStore);
            int64 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetInt64ConstantValue(&symStoreIntConstantValue, false) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewInt64ConstantValue(intConst, instr);
    }

    return this->currentBlock->globOptData.InsertNewValue(value, opnd);
}